

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

Vec_Int_t *
Gia_SimAbsPerformOne
          (Gia_Man_t *pGia,word *pOffSet,word *pOnSet,Vec_Wrd_t *vSimsCands,int nWords,int fVerbose)

{
  int iVar1;
  Vec_Int_t *vResub;
  int *piVar2;
  Gia_SimAbsMan_t *p;
  long lVar3;
  int level;
  long lVar4;
  timespec ts;
  timespec local_48;
  Vec_Wrd_t *local_38;
  
  local_38 = vSimsCands;
  iVar1 = clock_gettime(3,&local_48);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  vResub = (Vec_Int_t *)malloc(0x10);
  vResub->nCap = 0x10;
  vResub->nSize = 0;
  piVar2 = (int *)malloc(0x40);
  vResub->pArray = piVar2;
  p = Gia_SimAbsAlloc(pGia,pOffSet,pOnSet,local_38,nWords,vResub,fVerbose);
  Gia_SimAbsInit(p);
  do {
    Gia_SimAbsSolve(p);
    iVar1 = Gia_SimAbsRefine(p);
  } while (iVar1 != 0);
  Gia_SimAbsFree(p);
  level = 3;
  iVar1 = clock_gettime(3,&local_48);
  if (iVar1 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","Resubstitution time");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
  return vResub;
}

Assistant:

Vec_Int_t * Gia_SimAbsPerformOne( Gia_Man_t * pGia, word * pOffSet, word * pOnSet, Vec_Wrd_t * vSimsCands, int nWords, int fVerbose )
{
    abctime clk = Abc_Clock();
    Vec_Int_t * vResub  = Vec_IntAlloc( 10 );
    Gia_SimAbsMan_t * p = Gia_SimAbsAlloc( pGia, pOffSet, pOnSet, vSimsCands, nWords, vResub, fVerbose );
    Gia_SimAbsInit( p );
    while ( 1 )
    {
        Gia_SimAbsSolve( p );
        if ( !Gia_SimAbsRefine( p ) )
            break;
    }
    Gia_SimAbsFree( p );
    Abc_PrintTime( 1, "Resubstitution time", Abc_Clock() - clk );
    return vResub;
}